

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  uint *puVar1;
  fpclass_type fVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  fpclass_type fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  int *piVar19;
  long lVar20;
  int32_t iVar21;
  undefined1 uVar22;
  cpp_dec_float<100U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  uint local_578 [3];
  undefined3 uStack_56b;
  int iStack_568;
  bool bStack_564;
  undefined8 local_560;
  ulong local_550;
  cpp_dec_float<100U,_int,_void> local_548;
  int *local_4f8;
  long local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  ulong local_4e0;
  cpp_dec_float<100U,_int,_void> local_4d8;
  int *local_488;
  pointer local_480;
  int *local_478;
  int *local_470;
  long local_468;
  int *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  uint local_418 [3];
  undefined3 uStack_40b;
  int iStack_408;
  bool bStack_404;
  undefined8 local_400;
  undefined1 local_3f8 [24];
  uint auStack_3e0 [2];
  undefined1 local_3d8 [16];
  uint local_3c8 [3];
  undefined3 uStack_3bb;
  int iStack_3b8;
  bool bStack_3b4;
  undefined8 local_3b0;
  undefined1 local_3a8 [24];
  uint auStack_390 [2];
  undefined1 local_388 [16];
  uint local_378 [3];
  undefined3 uStack_36b;
  int iStack_368;
  bool bStack_364;
  undefined8 local_360;
  undefined1 local_358 [24];
  uint auStack_340 [2];
  undefined1 local_338 [16];
  uint local_328 [3];
  undefined3 uStack_31b;
  int iStack_318;
  bool bStack_314;
  undefined8 local_310;
  undefined1 local_308 [24];
  uint auStack_2f0 [2];
  undefined1 local_2e8 [16];
  uint local_2d8 [3];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b8 [24];
  uint auStack_2a0 [2];
  undefined1 local_298 [16];
  uint local_288 [3];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_4d8.fpclass = cpp_dec_float_finite;
  local_4d8.prec_elem = 0x10;
  local_4d8.data._M_elems[0] = 0;
  local_4d8.data._M_elems[1] = 0;
  local_4d8.data._M_elems[2] = 0;
  local_4d8.data._M_elems[3] = 0;
  local_4d8.data._M_elems[4] = 0;
  local_4d8.data._M_elems[5] = 0;
  local_4d8.data._M_elems[6] = 0;
  local_4d8.data._M_elems[7] = 0;
  local_4d8.data._M_elems[8] = 0;
  local_4d8.data._M_elems[9] = 0;
  local_4d8.data._M_elems[10] = 0;
  local_4d8.data._M_elems[0xb] = 0;
  local_4d8.data._M_elems[0xc] = 0;
  local_4d8.data._M_elems[0xd] = 0;
  local_4d8.data._M_elems._56_5_ = 0;
  uVar13 = 0;
  local_4d8.data._M_elems[0xf]._1_3_ = 0;
  local_4d8.exp = 0;
  local_4d8.neg = false;
  local_548.fpclass = cpp_dec_float_finite;
  local_548.prec_elem = 0x10;
  local_548.data._M_elems[0] = 0;
  local_548.data._M_elems[1] = 0;
  local_548.data._M_elems[2] = 0;
  local_548.data._M_elems[3] = 0;
  local_548.data._M_elems[4] = 0;
  local_548.data._M_elems[5] = 0;
  local_548.data._M_elems[6] = 0;
  local_548.data._M_elems[7] = 0;
  local_548.data._M_elems[8] = 0;
  local_548.data._M_elems[9] = 0;
  local_548.data._M_elems[10] = 0;
  local_548.data._M_elems[0xb] = 0;
  local_548.data._M_elems[0xc] = 0;
  local_548.data._M_elems[0xd] = 0;
  local_548.data._M_elems._56_5_ = 0;
  local_548.data._M_elems[0xf]._1_3_ = 0;
  local_548.exp = 0;
  local_548.neg = false;
  local_480 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_488 = (this->l).idx;
  local_460 = (this->l).row;
  local_4f8 = (this->l).start;
  local_468 = (long)(this->l).firstUpdate;
  local_4e8 = vec;
  local_478 = ridx;
  local_470 = rn;
  local_458 = eps;
  if (0 < local_468) {
    lVar20 = 0;
    local_450 = this;
    do {
      iVar14 = local_460[lVar20];
      local_548.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar14].m_backend.data._M_elems;
      local_548.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar14].m_backend.data._M_elems + 2);
      puVar1 = vec2[iVar14].m_backend.data._M_elems + 4;
      local_548.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_548.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec2[iVar14].m_backend.data._M_elems + 8;
      local_548.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_548.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec2[iVar14].m_backend.data._M_elems + 0xc;
      local_548.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_548.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_548.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_548.exp = vec2[iVar14].m_backend.exp;
      local_548.neg = vec2[iVar14].m_backend.neg;
      local_548.fpclass = vec2[iVar14].m_backend.fpclass;
      local_548.prec_elem = vec2[iVar14].m_backend.prec_elem;
      local_4d8.data._M_elems._0_8_ = *(undefined8 *)local_4e8[iVar14].m_backend.data._M_elems;
      local_4d8.data._M_elems._8_8_ = *(undefined8 *)(local_4e8[iVar14].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 4;
      local_4d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_4d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 8;
      local_4d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_4d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 0xc;
      local_4d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_4d8.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_4d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      iStack_568 = local_4e8[iVar14].m_backend.exp;
      local_4d8.neg = local_4e8[iVar14].m_backend.neg;
      local_4d8.fpclass = local_4e8[iVar14].m_backend.fpclass;
      local_4d8.prec_elem = local_4e8[iVar14].m_backend.prec_elem;
      local_5a8._0_8_ = *(undefined8 *)local_4e8[iVar14].m_backend.data._M_elems;
      local_5a8._8_8_ = *(undefined8 *)(local_4e8[iVar14].m_backend.data._M_elems + 2);
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 4;
      local_598._0_8_ = *(undefined8 *)puVar1;
      local_598._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 8;
      local_588._0_8_ = *(undefined8 *)puVar1;
      local_588._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_4e8[iVar14].m_backend.data._M_elems + 0xc;
      local_578._0_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffffa90 = (undefined5)uVar4;
      uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(local_458->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 0xc);
      local_88.data._M_elems._56_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 0xe);
      local_88.exp = (local_458->m_backend).exp;
      local_88.neg = (local_458->m_backend).neg;
      local_88.fpclass = (local_458->m_backend).fpclass;
      local_88.prec_elem = (local_458->m_backend).prec_elem;
      local_560._4_4_ = local_4d8.prec_elem;
      local_560._0_4_ = local_4d8.fpclass;
      bStack_564 = local_4d8.neg;
      if ((local_4d8.neg == true) &&
         (local_5a8._0_4_ != 0 || local_4d8.fpclass != cpp_dec_float_finite)) {
        bStack_564 = false;
      }
      local_4f0 = lVar20;
      local_4d8.exp = iStack_568;
      if (local_88.fpclass == cpp_dec_float_NaN || local_4d8.fpclass == cpp_dec_float_NaN) {
        iVar14 = (eps2->m_backend).exp;
        uVar22 = (eps2->m_backend).neg;
        iVar21 = (eps2->m_backend).prec_elem;
        local_560._0_4_ = local_548.fpclass;
        local_560._4_4_ = local_548.prec_elem;
        fVar2 = (eps2->m_backend).fpclass;
LAB_003edc27:
        local_268.fpclass = fVar2;
        local_578[0] = local_548.data._M_elems[0xc];
        local_578[1] = local_548.data._M_elems[0xd];
        stack0xfffffffffffffa90 = local_548.data._M_elems._56_5_;
        uStack_56b = local_548.data._M_elems[0xf]._1_3_;
        local_588._8_4_ = local_548.data._M_elems[10];
        local_588._12_4_ = local_548.data._M_elems[0xb];
        local_588._0_4_ = local_548.data._M_elems[8];
        local_588._4_4_ = local_548.data._M_elems[9];
        local_598._8_4_ = local_548.data._M_elems[6];
        local_598._12_4_ = local_548.data._M_elems[7];
        local_598._0_4_ = local_548.data._M_elems[4];
        local_598._4_4_ = local_548.data._M_elems[5];
        local_5a8._8_4_ = local_548.data._M_elems[2];
        local_5a8._12_4_ = local_548.data._M_elems[3];
        local_5a8._0_4_ = local_548.data._M_elems[0];
        local_5a8._4_4_ = local_548.data._M_elems[1];
        auVar5 = local_5a8;
        local_268.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_268.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_268.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_268.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_268.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_268.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_268.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        bStack_564 = local_548.neg;
        if (((local_548.neg & 1U) != 0) &&
           (local_5a8._0_4_ = local_548.data._M_elems[0],
           local_5a8._0_4_ != 0 || (fpclass_type)local_560 != cpp_dec_float_finite)) {
          bStack_564 = (bool)(local_548.neg ^ 1);
        }
        local_268.exp = iVar14;
        local_268.neg = (bool)uVar22;
        local_268.prec_elem = iVar21;
        if ((local_268.fpclass != cpp_dec_float_NaN && (fpclass_type)local_560 != cpp_dec_float_NaN)
           && (local_5a8 = auVar5, iStack_568 = local_548.exp,
              iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_5a8,&local_268),
              0 < iVar14)) {
          local_550 = (ulong)local_4f8[local_4f0];
          iVar14 = local_4f8[local_4f0 + 1];
          if (local_4f8[local_4f0] < iVar14) {
            pcVar23 = &local_480[local_550].m_backend;
            piVar19 = local_488 + local_550;
            do {
              iVar16 = *piVar19;
              local_3b0._0_4_ = cpp_dec_float_finite;
              local_3b0._4_4_ = 0x10;
              local_3f8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffc18 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8[0] = 0;
              local_3c8[1] = 0;
              stack0xfffffffffffffc40 = 0;
              uStack_3bb = 0;
              iStack_3b8 = 0;
              bStack_3b4 = false;
              pcVar18 = &local_548;
              if (pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_3f8) {
                local_3c8[0] = local_548.data._M_elems[0xc];
                local_3c8[1] = local_548.data._M_elems[0xd];
                stack0xfffffffffffffc40 = local_548.data._M_elems._56_5_;
                uStack_3bb = local_548.data._M_elems[0xf]._1_3_;
                local_3d8._8_4_ = local_548.data._M_elems[10];
                local_3d8._12_4_ = local_548.data._M_elems[0xb];
                local_3d8._0_4_ = local_548.data._M_elems[8];
                local_3d8._4_4_ = local_548.data._M_elems[9];
                auStack_3e0[0] = local_548.data._M_elems[6];
                auStack_3e0[1] = local_548.data._M_elems[7];
                local_3f8._16_4_ = local_548.data._M_elems[4];
                local_3f8._20_4_ = local_548.data._M_elems[5];
                local_3f8._8_4_ = local_548.data._M_elems[2];
                local_3f8._12_4_ = local_548.data._M_elems[3];
                local_3f8._0_4_ = local_548.data._M_elems[0];
                local_3f8._4_4_ = local_548.data._M_elems[1];
                iStack_3b8 = local_548.exp;
                bStack_3b4 = local_548.neg;
                local_3b0._0_4_ = local_548.fpclass;
                local_3b0._4_4_ = local_548.prec_elem;
                pcVar18 = pcVar23;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_3f8,pcVar18);
              pcVar18 = &vec2[iVar16].m_backend;
              if (vec2[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
                local_560._0_4_ = cpp_dec_float_finite;
                local_560._4_4_ = 0x10;
                local_5a8 = (undefined1  [16])0x0;
                local_598 = (undefined1  [16])0x0;
                local_588 = (undefined1  [16])0x0;
                local_578[0] = 0;
                local_578[1] = 0;
                stack0xfffffffffffffa90 = 0;
                uStack_56b = 0;
                iStack_568 = 0;
                bStack_564 = false;
                pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
                local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
                local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
                local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                stack0xfffffffffffffa90 = (undefined5)uVar4;
                uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_568 = pcVar17->exp;
                bStack_564 = pcVar17->neg;
                local_560._0_4_ = pcVar17->fpclass;
                local_560._4_4_ = pcVar17->prec_elem;
                iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
                if (iVar15 == 0) {
                  ridx2[*rn2] = iVar16;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_3f8);
              if (pcVar18->fpclass != cpp_dec_float_NaN) {
                local_560._0_4_ = cpp_dec_float_finite;
                local_560._4_4_ = 0x10;
                local_5a8 = (undefined1  [16])0x0;
                local_598 = (undefined1  [16])0x0;
                local_588 = (undefined1  [16])0x0;
                local_578[0] = 0;
                local_578[1] = 0;
                stack0xfffffffffffffa90 = 0;
                uStack_56b = 0;
                iStack_568 = 0;
                bStack_564 = false;
                pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
                local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
                local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
                local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
                stack0xfffffffffffffa90 = (undefined5)uVar4;
                uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_568 = pcVar17->exp;
                bStack_564 = pcVar17->neg;
                local_560._0_4_ = pcVar17->fpclass;
                local_560._4_4_ = pcVar17->prec_elem;
                iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
                if (iVar16 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar18,1e-100);
                }
              }
              piVar19 = piVar19 + 1;
              pcVar23 = pcVar23 + 1;
              iVar14 = iVar14 + -1;
            } while ((int)local_550 < iVar14);
          }
        }
      }
      else {
        iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)local_5a8,&local_88);
        fVar7 = local_548.fpclass;
        iVar14 = (eps2->m_backend).exp;
        uVar22 = (eps2->m_backend).neg;
        fVar2 = (eps2->m_backend).fpclass;
        iVar21 = (eps2->m_backend).prec_elem;
        local_560._0_4_ = local_548.fpclass;
        local_560._4_4_ = local_548.prec_elem;
        if (iVar16 < 1) goto LAB_003edc27;
        local_550 = (ulong)local_4f8[lVar20];
        local_578[0] = local_548.data._M_elems[0xc];
        local_578[1] = local_548.data._M_elems[0xd];
        stack0xfffffffffffffa90 = local_548.data._M_elems._56_5_;
        uStack_56b = local_548.data._M_elems[0xf]._1_3_;
        local_588._8_4_ = local_548.data._M_elems[10];
        local_588._12_4_ = local_548.data._M_elems[0xb];
        local_588._0_4_ = local_548.data._M_elems[8];
        local_588._4_4_ = local_548.data._M_elems[9];
        local_598._8_4_ = local_548.data._M_elems[6];
        local_598._12_4_ = local_548.data._M_elems[7];
        local_598._0_4_ = local_548.data._M_elems[4];
        local_598._4_4_ = local_548.data._M_elems[5];
        local_5a8._8_4_ = local_548.data._M_elems[2];
        local_5a8._12_4_ = local_548.data._M_elems[3];
        local_5a8._0_4_ = local_548.data._M_elems[0];
        local_5a8._4_4_ = local_548.data._M_elems[1];
        auVar5 = local_5a8;
        local_218.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_218.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_218.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_218.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_218.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_218.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_218.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_218.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        iStack_568 = local_548.exp;
        bStack_564 = local_548.neg;
        local_560._0_4_ = local_548.fpclass;
        local_560._4_4_ = local_548.prec_elem;
        if (((local_548.neg & 1U) != 0) &&
           (local_5a8._0_4_ = local_548.data._M_elems[0],
           local_5a8._0_4_ != 0 || fVar7 != cpp_dec_float_finite)) {
          bStack_564 = (bool)(local_548.neg ^ 1);
        }
        piVar19 = local_488 + local_550;
        pcVar23 = &local_480[local_550].m_backend;
        local_5a8 = auVar5;
        local_218.exp = iVar14;
        local_218.neg = (bool)uVar22;
        local_218.fpclass = fVar2;
        local_218.prec_elem = iVar21;
        if ((fVar2 == cpp_dec_float_NaN || fVar7 == cpp_dec_float_NaN) ||
           (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_5a8,&local_218), iVar14 < 1)
           ) {
          for (iVar14 = local_4f8[lVar20 + 1]; (int)local_550 < iVar14; iVar14 = iVar14 + -1) {
            iVar16 = *piVar19;
            local_360._0_4_ = cpp_dec_float_finite;
            local_360._4_4_ = 0x10;
            local_3a8._0_16_ = (undefined1  [16])0x0;
            stack0xfffffffffffffc68 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378[0] = 0;
            local_378[1] = 0;
            stack0xfffffffffffffc90 = 0;
            uStack_36b = 0;
            iStack_368 = 0;
            bStack_364 = false;
            pcVar18 = &local_4d8;
            if (pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_3a8) {
              local_378[0] = local_4d8.data._M_elems[0xc];
              local_378[1] = local_4d8.data._M_elems[0xd];
              stack0xfffffffffffffc90 = local_4d8.data._M_elems._56_5_;
              uStack_36b = local_4d8.data._M_elems[0xf]._1_3_;
              local_388._8_4_ = local_4d8.data._M_elems[10];
              local_388._12_4_ = local_4d8.data._M_elems[0xb];
              local_388._0_4_ = local_4d8.data._M_elems[8];
              local_388._4_4_ = local_4d8.data._M_elems[9];
              auStack_390[0] = local_4d8.data._M_elems[6];
              auStack_390[1] = local_4d8.data._M_elems[7];
              local_3a8._16_4_ = local_4d8.data._M_elems[4];
              local_3a8._20_4_ = local_4d8.data._M_elems[5];
              local_3a8._8_4_ = local_4d8.data._M_elems[2];
              local_3a8._12_4_ = local_4d8.data._M_elems[3];
              local_3a8._0_4_ = local_4d8.data._M_elems[0];
              local_3a8._4_4_ = local_4d8.data._M_elems[1];
              iStack_368 = local_4d8.exp;
              bStack_364 = local_4d8.neg;
              local_360._0_4_ = local_4d8.fpclass;
              local_360._4_4_ = local_4d8.prec_elem;
              pcVar18 = pcVar23;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_3a8,pcVar18);
            pcVar18 = &local_4e8[iVar16].m_backend;
            if (local_4e8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar15 == 0) {
                local_478[*local_470] = iVar16;
                *local_470 = *local_470 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_3a8);
            if (pcVar18->fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar16 == 0) {
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)pcVar18,1e-100);
              }
            }
            piVar19 = piVar19 + 1;
            pcVar23 = pcVar23 + 1;
          }
        }
        else {
          for (iVar14 = local_4f8[lVar20 + 1]; (int)local_550 < iVar14; iVar14 = iVar14 + -1) {
            iVar16 = *piVar19;
            local_2c0._0_4_ = cpp_dec_float_finite;
            local_2c0._4_4_ = 0x10;
            local_308._0_16_ = (undefined1  [16])0x0;
            stack0xfffffffffffffd08 = (undefined1  [16])0x0;
            local_2e8 = (undefined1  [16])0x0;
            local_2d8[0] = 0;
            local_2d8[1] = 0;
            stack0xfffffffffffffd30 = 0;
            uStack_2cb = 0;
            iStack_2c8 = 0;
            bStack_2c4 = false;
            pcVar18 = &local_4d8;
            if (pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_308) {
              local_2d8[0] = local_4d8.data._M_elems[0xc];
              local_2d8[1] = local_4d8.data._M_elems[0xd];
              stack0xfffffffffffffd30 = local_4d8.data._M_elems._56_5_;
              uStack_2cb = local_4d8.data._M_elems[0xf]._1_3_;
              local_2e8._8_4_ = local_4d8.data._M_elems[10];
              local_2e8._12_4_ = local_4d8.data._M_elems[0xb];
              local_2e8._0_4_ = local_4d8.data._M_elems[8];
              local_2e8._4_4_ = local_4d8.data._M_elems[9];
              auStack_2f0[0] = local_4d8.data._M_elems[6];
              auStack_2f0[1] = local_4d8.data._M_elems[7];
              local_308._16_4_ = local_4d8.data._M_elems[4];
              local_308._20_4_ = local_4d8.data._M_elems[5];
              local_308._8_4_ = local_4d8.data._M_elems[2];
              local_308._12_4_ = local_4d8.data._M_elems[3];
              local_308._0_4_ = local_4d8.data._M_elems[0];
              local_308._4_4_ = local_4d8.data._M_elems[1];
              iStack_2c8 = local_4d8.exp;
              bStack_2c4 = local_4d8.neg;
              local_2c0._0_4_ = local_4d8.fpclass;
              local_2c0._4_4_ = local_4d8.prec_elem;
              pcVar18 = pcVar23;
            }
            local_4e0 = CONCAT44(local_4e0._4_4_,iVar16);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_308,pcVar18);
            pcVar18 = &local_4e8[iVar16].m_backend;
            if (local_4e8[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar15 == 0) {
                local_478[*local_470] = (int)local_4e0;
                *local_470 = *local_470 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_308);
            if (pcVar18->fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar15 == 0) {
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)pcVar18,1e-100);
              }
            }
            local_310._0_4_ = cpp_dec_float_finite;
            local_310._4_4_ = 0x10;
            local_358._0_16_ = (undefined1  [16])0x0;
            stack0xfffffffffffffcb8 = (undefined1  [16])0x0;
            local_338 = (undefined1  [16])0x0;
            local_328[0] = 0;
            local_328[1] = 0;
            stack0xfffffffffffffce0 = 0;
            uStack_31b = 0;
            iStack_318 = 0;
            bStack_314 = false;
            pcVar18 = &local_548;
            if (pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_358) {
              local_328[0] = local_548.data._M_elems[0xc];
              local_328[1] = local_548.data._M_elems[0xd];
              stack0xfffffffffffffce0 = local_548.data._M_elems._56_5_;
              uStack_31b = local_548.data._M_elems[0xf]._1_3_;
              local_338._8_4_ = local_548.data._M_elems[10];
              local_338._12_4_ = local_548.data._M_elems[0xb];
              local_338._0_4_ = local_548.data._M_elems[8];
              local_338._4_4_ = local_548.data._M_elems[9];
              auStack_340[0] = local_548.data._M_elems[6];
              auStack_340[1] = local_548.data._M_elems[7];
              local_358._16_4_ = local_548.data._M_elems[4];
              local_358._20_4_ = local_548.data._M_elems[5];
              local_358._8_4_ = local_548.data._M_elems[2];
              local_358._12_4_ = local_548.data._M_elems[3];
              local_358._0_4_ = local_548.data._M_elems[0];
              local_358._4_4_ = local_548.data._M_elems[1];
              iStack_318 = local_548.exp;
              bStack_314 = local_548.neg;
              local_310._0_4_ = local_548.fpclass;
              local_310._4_4_ = local_548.prec_elem;
              pcVar18 = pcVar23;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                      ((cpp_dec_float<100U,_int,_void> *)local_358,pcVar18);
            pcVar18 = &vec2[iVar16].m_backend;
            if (vec2[iVar16].m_backend.fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar16 == 0) {
                ridx2[*rn2] = (int)local_4e0;
                *rn2 = *rn2 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_358);
            if (pcVar18->fpclass != cpp_dec_float_NaN) {
              local_560._0_4_ = cpp_dec_float_finite;
              local_560._4_4_ = 0x10;
              local_5a8 = (undefined1  [16])0x0;
              local_598 = (undefined1  [16])0x0;
              local_588 = (undefined1  [16])0x0;
              local_578[0] = 0;
              local_578[1] = 0;
              stack0xfffffffffffffa90 = 0;
              uStack_56b = 0;
              iStack_568 = 0;
              bStack_564 = false;
              pcVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
              local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
              local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
              local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
              local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
              stack0xfffffffffffffa90 = (undefined5)uVar4;
              uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_568 = pcVar17->exp;
              bStack_564 = pcVar17->neg;
              local_560._0_4_ = pcVar17->fpclass;
              local_560._4_4_ = pcVar17->prec_elem;
              iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar18,(cpp_dec_float<100U,_int,_void> *)local_5a8);
              if (iVar16 == 0) {
                boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                          ((cpp_dec_float<100u,int,void> *)pcVar18,1e-100);
              }
            }
            piVar19 = piVar19 + 1;
            pcVar23 = pcVar23 + 1;
          }
        }
      }
      lVar20 = local_4f0 + 1;
    } while (lVar20 != local_468);
    uVar13 = (uint)local_468;
    this = local_450;
  }
  if (((this->l).updateType != 0) &&
     (uVar3 = (this->l).firstUnused, local_4e0 = (ulong)uVar3, (int)uVar13 < (int)uVar3)) {
    local_550 = (ulong)uVar13;
    do {
      iVar14 = local_4f8[local_550];
      local_400._0_4_ = cpp_dec_float_finite;
      local_400._4_4_ = 0x10;
      local_448 = (undefined1  [16])0x0;
      local_438 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      local_418[0] = 0;
      local_418[1] = 0;
      stack0xfffffffffffffbf0 = 0;
      uStack_40b = 0;
      iStack_408 = 0;
      bStack_404 = false;
      local_270._0_4_ = cpp_dec_float_finite;
      local_270._4_4_ = 0x10;
      local_2b8._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffd58 = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      local_288[0] = 0;
      local_288[1] = 0;
      stack0xfffffffffffffd80 = 0;
      uStack_27b = 0;
      iStack_278 = 0;
      bStack_274 = false;
      iVar16 = local_4f8[local_550 + 1];
      if (iVar14 < iVar16) {
        pcVar23 = &local_480[iVar14].m_backend;
        piVar19 = local_488 + iVar14;
        do {
          pcVar17 = &local_4e8[*piVar19].m_backend;
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = pcVar17;
          if ((pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_5a8) &&
             (pcVar18 = pcVar23, (cpp_dec_float<100U,_int,_void> *)local_5a8 != pcVar17)) {
            local_5a8 = *(undefined1 (*) [16])
                         (((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems;
            local_598 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 4);
            local_588 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 8);
            local_578._0_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)
                     ((((cpp_dec_float<100U,_int,_void> *)&pcVar17->data)->data)._M_elems + 0xe);
            stack0xfffffffffffffa90 = (undefined5)uVar4;
            uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
            iStack_568 = pcVar17->exp;
            bStack_564 = pcVar17->neg;
            local_560._0_4_ = pcVar17->fpclass;
            local_560._4_4_ = pcVar17->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_5a8,pcVar18);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_448,
                     (cpp_dec_float<100U,_int,_void> *)local_5a8);
          pcVar17 = &vec2[*piVar19].m_backend;
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = pcVar17;
          if ((pcVar23 != (cpp_dec_float<100U,_int,_void> *)local_5a8) &&
             (pcVar18 = pcVar23, (cpp_dec_float<100U,_int,_void> *)local_5a8 != pcVar17)) {
            local_5a8 = *(undefined1 (*) [16])(pcVar17->data)._M_elems;
            local_598 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 4);
            local_588 = *(undefined1 (*) [16])((pcVar17->data)._M_elems + 8);
            local_578._0_8_ = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
            stack0xfffffffffffffa90 = (undefined5)uVar4;
            uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
            iStack_568 = pcVar17->exp;
            bStack_564 = pcVar17->neg;
            local_560._0_4_ = pcVar17->fpclass;
            local_560._4_4_ = pcVar17->prec_elem;
          }
          piVar19 = piVar19 + 1;
          pcVar23 = pcVar23 + 1;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_5a8,pcVar18);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_2b8,
                     (cpp_dec_float<100U,_int,_void> *)local_5a8);
          iVar16 = iVar16 + -1;
        } while (iVar14 < iVar16);
        local_4d8.fpclass = (fpclass_type)local_400;
        local_4d8.prec_elem = local_400._4_4_;
      }
      else {
        local_4d8.prec_elem = 0x10;
        local_4d8.fpclass = cpp_dec_float_finite;
      }
      auVar10 = local_298;
      auVar9 = stack0xfffffffffffffd58;
      auVar8 = local_2b8._0_16_;
      local_588 = local_428;
      local_598 = local_438;
      local_5a8 = local_448;
      uVar6 = local_550;
      local_4d8.data._M_elems[0xc] = local_418[0];
      local_4d8.data._M_elems[0xd] = local_418[1];
      local_4d8.data._M_elems._56_5_ = stack0xfffffffffffffbf0;
      local_4d8.data._M_elems[0xf]._1_3_ = uStack_40b;
      local_4d8.data._M_elems[8] = local_428._0_4_;
      local_4d8.data._M_elems[9] = local_428._4_4_;
      uVar12 = local_4d8.data._M_elems._32_8_;
      local_4d8.data._M_elems[8] = local_428._0_4_;
      local_4d8.data._M_elems[9] = local_428._4_4_;
      local_4d8.data._M_elems[10] = local_428._8_4_;
      local_4d8.data._M_elems[0xb] = local_428._12_4_;
      local_4d8.data._M_elems[4] = local_438._0_4_;
      local_4d8.data._M_elems[5] = local_438._4_4_;
      uVar11 = local_4d8.data._M_elems._16_8_;
      local_4d8.data._M_elems[4] = local_438._0_4_;
      local_4d8.data._M_elems[5] = local_438._4_4_;
      local_4d8.data._M_elems[6] = local_438._8_4_;
      local_4d8.data._M_elems[7] = local_438._12_4_;
      local_4d8.data._M_elems[0] = local_448._0_4_;
      local_4d8.data._M_elems[1] = local_448._4_4_;
      uVar4 = local_4d8.data._M_elems._0_8_;
      local_4d8.data._M_elems[0] = local_448._0_4_;
      local_4d8.data._M_elems[1] = local_448._4_4_;
      local_4d8.data._M_elems[2] = local_448._8_4_;
      local_4d8.data._M_elems[3] = local_448._12_4_;
      local_548.data._M_elems[0] = local_2b8._0_4_;
      local_548.data._M_elems[1] = local_2b8._4_4_;
      local_548.data._M_elems[2] = local_2b8._8_4_;
      local_548.data._M_elems[3] = local_2b8._12_4_;
      local_548.data._M_elems[4] = local_2b8._16_4_;
      local_548.data._M_elems[5] = local_2b8._20_4_;
      local_548.data._M_elems[6] = auStack_2a0[0];
      local_548.data._M_elems[7] = auStack_2a0[1];
      local_548.data._M_elems[8] = local_298._0_4_;
      local_548.data._M_elems[9] = local_298._4_4_;
      local_548.data._M_elems[10] = local_298._8_4_;
      local_548.data._M_elems[0xb] = local_298._12_4_;
      local_548.data._M_elems[0xc] = local_288[0];
      local_548.data._M_elems[0xd] = local_288[1];
      local_548.data._M_elems._56_5_ = stack0xfffffffffffffd80;
      local_548.data._M_elems[0xf]._1_3_ = uStack_27b;
      iVar14 = local_460[local_550];
      local_578[0] = local_418[0];
      local_578[1] = local_418[1];
      stack0xfffffffffffffa90 = stack0xfffffffffffffbf0;
      uStack_56b = uStack_40b;
      auVar5 = local_5a8;
      local_d8.data._M_elems._0_8_ = *(undefined8 *)(local_458->m_backend).data._M_elems;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 2);
      local_d8.data._M_elems._16_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 4);
      local_d8.data._M_elems._24_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 6);
      local_d8.data._M_elems._32_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 8);
      local_d8.data._M_elems._40_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 10);
      local_d8.data._M_elems._48_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 0xc);
      local_d8.data._M_elems._56_8_ = *(undefined8 *)((local_458->m_backend).data._M_elems + 0xe);
      local_d8.exp = (local_458->m_backend).exp;
      local_d8.neg = (local_458->m_backend).neg;
      local_d8.fpclass = (local_458->m_backend).fpclass;
      local_d8.prec_elem = (local_458->m_backend).prec_elem;
      local_560._4_4_ = local_4d8.prec_elem;
      local_560._0_4_ = local_4d8.fpclass;
      bStack_564 = bStack_404;
      if (((bStack_404 & 1U) != 0) &&
         (local_5a8._0_4_ != 0 || local_4d8.fpclass != cpp_dec_float_finite)) {
        bStack_564 = (bool)(bStack_404 ^ 1);
      }
      local_4f0 = CONCAT44(local_4f0._4_4_,iVar14);
      local_548.exp = iStack_278;
      local_548.neg = bStack_274;
      local_548._72_8_ = local_270;
      local_4d8.exp = iStack_408;
      local_4d8.neg = bStack_404;
      local_448 = local_5a8;
      local_438 = local_598;
      local_428 = local_588;
      local_2b8._0_16_ = auVar8;
      unique0x10004e68 = auVar9;
      local_298 = auVar10;
      if ((local_d8.fpclass != cpp_dec_float_NaN && local_4d8.fpclass != cpp_dec_float_NaN) &&
         (local_5a8 = auVar5, iStack_568 = iStack_408,
         iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_5a8,&local_d8),
         uVar4 = local_4d8.data._M_elems._0_8_, uVar11 = local_4d8.data._M_elems._16_8_,
         uVar12 = local_4d8.data._M_elems._32_8_, 0 < iVar16)) {
        local_128.data._M_elems[0xf]._1_3_ = local_4d8.data._M_elems[0xf]._1_3_;
        local_128.data._M_elems._56_5_ = local_4d8.data._M_elems._56_5_;
        local_128.data._M_elems[0xc] = local_4d8.data._M_elems[0xc];
        local_128.data._M_elems[0xd] = local_4d8.data._M_elems[0xd];
        local_128.data._M_elems[8] = local_4d8.data._M_elems[8];
        local_128.data._M_elems[9] = local_4d8.data._M_elems[9];
        local_128.data._M_elems[10] = local_4d8.data._M_elems[10];
        local_128.data._M_elems[0xb] = local_4d8.data._M_elems[0xb];
        local_128.data._M_elems[4] = local_4d8.data._M_elems[4];
        local_128.data._M_elems[5] = local_4d8.data._M_elems[5];
        local_128.data._M_elems[6] = local_4d8.data._M_elems[6];
        local_128.data._M_elems[7] = local_4d8.data._M_elems[7];
        local_128.data._M_elems[0] = local_4d8.data._M_elems[0];
        local_128.data._M_elems[1] = local_4d8.data._M_elems[1];
        local_128.data._M_elems[2] = local_4d8.data._M_elems[2];
        local_128.data._M_elems[3] = local_4d8.data._M_elems[3];
        local_128.exp = local_4d8.exp;
        local_128.neg = local_4d8.neg;
        local_128.fpclass = local_4d8.fpclass;
        local_128.prec_elem = local_4d8.prec_elem;
        pcVar23 = &local_4e8[iVar14].m_backend;
        if (local_4e8[iVar14].m_backend.fpclass != cpp_dec_float_NaN) {
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_5a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_598 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
          local_588 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
          local_578._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          stack0xfffffffffffffa90 = (undefined5)uVar4;
          uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_568 = pcVar18->exp;
          bStack_564 = pcVar18->neg;
          local_560._0_4_ = pcVar18->fpclass;
          local_560._4_4_ = pcVar18->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_5a8);
          if (iVar16 == 0) {
            local_478[*local_470] = (int)local_4f0;
            *local_470 = *local_470 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar23,&local_128);
        uVar4 = local_4d8.data._M_elems._0_8_;
        uVar11 = local_4d8.data._M_elems._16_8_;
        uVar12 = local_4d8.data._M_elems._32_8_;
        if (pcVar23->fpclass != cpp_dec_float_NaN) {
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_5a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_598 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
          local_588 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
          local_578._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          stack0xfffffffffffffa90 = (undefined5)uVar4;
          uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_568 = pcVar18->exp;
          bStack_564 = pcVar18->neg;
          local_560._0_4_ = pcVar18->fpclass;
          local_560._4_4_ = pcVar18->prec_elem;
          iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_5a8);
          uVar4 = local_4d8.data._M_elems._0_8_;
          uVar11 = local_4d8.data._M_elems._16_8_;
          uVar12 = local_4d8.data._M_elems._32_8_;
          if (iVar16 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar23,1e-100);
            uVar4 = local_4d8.data._M_elems._0_8_;
            uVar11 = local_4d8.data._M_elems._16_8_;
            uVar12 = local_4d8.data._M_elems._32_8_;
          }
        }
      }
      local_4d8.data._M_elems._32_8_ = uVar12;
      local_4d8.data._M_elems._16_8_ = uVar11;
      local_4d8.data._M_elems._0_8_ = uVar4;
      local_578[0] = local_548.data._M_elems[0xc];
      local_578[1] = local_548.data._M_elems[0xd];
      stack0xfffffffffffffa90 = local_548.data._M_elems._56_5_;
      uStack_56b = local_548.data._M_elems[0xf]._1_3_;
      local_588._8_4_ = local_548.data._M_elems[10];
      local_588._12_4_ = local_548.data._M_elems[0xb];
      local_588._0_4_ = local_548.data._M_elems[8];
      local_588._4_4_ = local_548.data._M_elems[9];
      local_598._8_4_ = local_548.data._M_elems[6];
      local_598._12_4_ = local_548.data._M_elems[7];
      local_598._0_4_ = local_548.data._M_elems[4];
      local_598._4_4_ = local_548.data._M_elems[5];
      local_5a8._8_4_ = local_548.data._M_elems[2];
      local_5a8._12_4_ = local_548.data._M_elems[3];
      local_5a8._0_4_ = local_548.data._M_elems[0];
      local_5a8._4_4_ = local_548.data._M_elems[1];
      auVar5 = local_5a8;
      local_178.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_178.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_178.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_178.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_178.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_178.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_178.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_178.exp = (eps2->m_backend).exp;
      local_178.neg = (eps2->m_backend).neg;
      local_178.fpclass = (eps2->m_backend).fpclass;
      local_178.prec_elem = (eps2->m_backend).prec_elem;
      iStack_568 = local_548.exp;
      bStack_564 = local_548.neg;
      local_560._0_4_ = local_548.fpclass;
      local_560._4_4_ = local_548.prec_elem;
      if ((local_548.neg == true) &&
         (local_5a8._0_4_ = local_548.data._M_elems[0],
         local_5a8._0_4_ != 0 || local_548.fpclass != cpp_dec_float_finite)) {
        bStack_564 = false;
      }
      if ((local_178.fpclass != cpp_dec_float_NaN && local_548.fpclass != cpp_dec_float_NaN) &&
         (local_5a8 = auVar5,
         iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_5a8,&local_178), 0 < iVar16)) {
        local_1c8.data._M_elems[0xf]._1_3_ = local_548.data._M_elems[0xf]._1_3_;
        local_1c8.data._M_elems._56_5_ = local_548.data._M_elems._56_5_;
        local_1c8.data._M_elems[0xc] = local_548.data._M_elems[0xc];
        local_1c8.data._M_elems[0xd] = local_548.data._M_elems[0xd];
        local_1c8.data._M_elems[8] = local_548.data._M_elems[8];
        local_1c8.data._M_elems[9] = local_548.data._M_elems[9];
        local_1c8.data._M_elems[10] = local_548.data._M_elems[10];
        local_1c8.data._M_elems[0xb] = local_548.data._M_elems[0xb];
        local_1c8.data._M_elems[4] = local_548.data._M_elems[4];
        local_1c8.data._M_elems[5] = local_548.data._M_elems[5];
        local_1c8.data._M_elems[6] = local_548.data._M_elems[6];
        local_1c8.data._M_elems[7] = local_548.data._M_elems[7];
        local_1c8.data._M_elems[0] = local_548.data._M_elems[0];
        local_1c8.data._M_elems[1] = local_548.data._M_elems[1];
        local_1c8.data._M_elems[2] = local_548.data._M_elems[2];
        local_1c8.data._M_elems[3] = local_548.data._M_elems[3];
        local_1c8.exp = local_548.exp;
        local_1c8.neg = local_548.neg;
        local_1c8.fpclass = local_548.fpclass;
        local_1c8.prec_elem = local_548.prec_elem;
        pcVar23 = &vec2[iVar14].m_backend;
        if (vec2[iVar14].m_backend.fpclass != cpp_dec_float_NaN) {
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_5a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_598 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
          local_588 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
          local_578._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          stack0xfffffffffffffa90 = (undefined5)uVar4;
          uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_568 = pcVar18->exp;
          bStack_564 = pcVar18->neg;
          local_560._0_4_ = pcVar18->fpclass;
          local_560._4_4_ = pcVar18->prec_elem;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_5a8);
          if (iVar14 == 0) {
            ridx2[*rn2] = (int)local_4f0;
            *rn2 = *rn2 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar23,&local_1c8);
        if (pcVar23->fpclass != cpp_dec_float_NaN) {
          local_560._0_4_ = cpp_dec_float_finite;
          local_560._4_4_ = 0x10;
          local_5a8 = (undefined1  [16])0x0;
          local_598 = (undefined1  [16])0x0;
          local_588 = (undefined1  [16])0x0;
          local_578[0] = 0;
          local_578[1] = 0;
          stack0xfffffffffffffa90 = 0;
          uStack_56b = 0;
          iStack_568 = 0;
          bStack_564 = false;
          pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_5a8 = *(undefined1 (*) [16])(pcVar18->data)._M_elems;
          local_598 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 4);
          local_588 = *(undefined1 (*) [16])((pcVar18->data)._M_elems + 8);
          local_578._0_8_ = *(undefined8 *)((pcVar18->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar18->data)._M_elems + 0xe);
          stack0xfffffffffffffa90 = (undefined5)uVar4;
          uStack_56b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_568 = pcVar18->exp;
          bStack_564 = pcVar18->neg;
          local_560._0_4_ = pcVar18->fpclass;
          local_560._4_4_ = pcVar18->prec_elem;
          iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<100U,_int,_void> *)local_5a8);
          if (iVar14 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar23,1e-100);
          }
        }
      }
      local_550 = uVar6 + 1;
    } while (local_550 != local_4e0);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}